

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O2

FUNCTION_RETURN getCpuId(uchar *identifier)

{
  uint *puVar1;
  long lVar2;
  uint cpuinfo [4];
  
  lVar2 = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  cpuinfo[0] = *puVar1;
  cpuinfo[1] = puVar1[1];
  cpuinfo[2] = puVar1[3];
  for (; lVar2 != 3; lVar2 = lVar2 + 1) {
    *(short *)(identifier + lVar2 * 2) = (short)cpuinfo[lVar2];
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN getCpuId(unsigned char identifier[6]) {
	unsigned int i;
	unsigned int cpuinfo[4] = { 0, 0, 0, 0 };
	_getCpuid(cpuinfo, 0);
	for (i = 0; i < 3; i++) {
		identifier[i * 2] = cpuinfo[i] & 0xFF;
		identifier[i * 2 + 1] = (cpuinfo[i] & 0xFF00) >> 8;
	}
	return FUNC_RET_OK;
}